

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O0

MPP_RET mpp_enc_refs_set_cfg(MppEncRefs refs,MppEncRefCfg ref_cfg)

{
  undefined4 uVar1;
  MPP_RET MVar2;
  int *__s;
  undefined4 *puVar3;
  undefined4 *puVar4;
  MppEncCpbInfo *info;
  MppEncRefLtFrmCfg *lt_cfg;
  RefsCnt *lt_cnt;
  RK_S32 i;
  MppEncRefCfgImpl *cfg;
  EncVirtualCpb *cpb;
  MppEncRefsImpl *p;
  MppEncRefCfg ref_cfg_local;
  MppEncRefs refs_local;
  
  if ((refs == (MppEncRefs)0x0) ||
     ((ref_cfg != (MppEncRefCfg)0x0 &&
      (MVar2 = _check_is_mpp_enc_ref_cfg("mpp_enc_refs_set_cfg",ref_cfg), MVar2 != MPP_OK)))) {
    _mpp_log_l(2,"mpp_enc_refs","invalid input refs %p ref_cfg %p\n","mpp_enc_refs_set_cfg",refs,
               ref_cfg);
    refs_local._4_4_ = MPP_ERR_VALUE;
  }
  else {
    if ((enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","enter %p cfg %p\n","mpp_enc_refs_set_cfg",refs,ref_cfg);
    }
    __s = (int *)((long)refs + 0x40);
    p = (MppEncRefsImpl *)ref_cfg;
    if (ref_cfg == (MppEncRefCfg)0x0) {
      p = (MppEncRefsImpl *)mpp_enc_ref_default();
    }
    *(MppEncRefsImpl **)((long)refs + 8) = p;
    *(uint *)refs = *refs | 1;
    *(undefined4 *)((long)refs + 0x38) = 0;
    if ((p->usr_cfg).force_flag == 0) {
      memset(__s,0,0x5a8);
      *(undefined4 *)((long)refs + 0x38) = 1;
    }
    if ((p->usr_cfg).force_nonref != 0) {
      if ((0xf < (p->usr_cfg).force_nonref) &&
         (_mpp_log_l(2,"mpp_enc_refs","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "cfg->lt_cfg_cnt < 16","mpp_enc_refs_set_cfg",0xf6),
         (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      for (lt_cnt._4_4_ = 0; lt_cnt._4_4_ < (p->usr_cfg).force_nonref;
          lt_cnt._4_4_ = lt_cnt._4_4_ + 1) {
        puVar3 = (undefined4 *)((long)refs + (long)lt_cnt._4_4_ * 0x24 + 0x360);
        puVar4 = (undefined4 *)(*(long *)&(p->usr_cfg).force_ref_mode + (long)lt_cnt._4_4_ * 0x18);
        *puVar3 = puVar4[5];
        puVar3[1] = puVar4[5];
        puVar3[2] = puVar4[4];
        puVar3[5] = *puVar4;
        puVar3[6] = puVar4[1];
        puVar3[7] = puVar4[2];
        puVar3[8] = puVar4[3];
      }
    }
    if ((*__s != 0) && (*__s < p->hdr_need_update)) {
      *(undefined4 *)((long)refs + 0x38) = 1;
    }
    uVar1 = *(undefined4 *)&p->field_0x3c;
    __s[0] = p->hdr_need_update;
    __s[1] = uVar1;
    *(undefined8 *)((long)refs + 0x48) = *(undefined8 *)&(p->cpb).info;
    *(undefined8 *)((long)refs + 0x50) = *(undefined8 *)&(p->cpb).info.max_st_cnt;
    *(RK_S32 *)((long)refs + 0x58) = (p->cpb).info.max_st_tid;
    if ((enc_refs_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","ref_cfg cpb size: lt %d st %d max lt_idx %d tid %d\n",
                 "mpp_enc_refs_set_cfg",(ulong)*(uint *)((long)refs + 0x44),
                 (ulong)*(uint *)((long)refs + 0x48),*(undefined4 *)((long)refs + 0x4c),
                 *(undefined4 *)((long)refs + 0x50));
    }
    if ((enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","leave %p cfg %p\n","mpp_enc_refs_set_cfg",refs,p);
    }
    refs_local._4_4_ = MPP_OK;
  }
  return refs_local._4_4_;
}

Assistant:

MPP_RET mpp_enc_refs_set_cfg(MppEncRefs refs, MppEncRefCfg ref_cfg)
{
    if (NULL == refs || (ref_cfg && check_is_mpp_enc_ref_cfg(ref_cfg))) {
        mpp_err_f("invalid input refs %p ref_cfg %p\n", refs, ref_cfg);
        return MPP_ERR_VALUE;
    }

    enc_refs_dbg_func("enter %p cfg %p\n", refs, ref_cfg);

    MppEncRefsImpl *p = (MppEncRefsImpl *)refs;
    EncVirtualCpb *cpb = &p->cpb;
    MppEncRefCfgImpl *cfg = NULL;

    if (NULL == ref_cfg)
        ref_cfg = mpp_enc_ref_default();

    cfg = (MppEncRefCfgImpl *)ref_cfg;

    p->ref_cfg = cfg;
    p->changed |= ENC_REFS_REF_CFG_CHANGED;
    p->hdr_need_update = 0;

    /* clear cpb on setup new cfg */
    if (!cfg->keep_cpb) {
        memset(cpb, 0, sizeof(*cpb));
        p->hdr_need_update = 1;
    }

    if (cfg->lt_cfg_cnt) {
        RK_S32 i;

        mpp_assert(cfg->lt_cfg_cnt < MAX_CPB_LT_FRM);

        for (i = 0; i < cfg->lt_cfg_cnt; i++) {
            RefsCnt *lt_cnt = &cpb->lt_cnter[i];
            MppEncRefLtFrmCfg *lt_cfg = &cfg->lt_cfg[i];

            lt_cnt->delay       = lt_cfg->lt_delay;
            lt_cnt->delay_cnt   = lt_cfg->lt_delay;
            lt_cnt->len         = lt_cfg->lt_gap;
            lt_cnt->lt_idx      = lt_cfg->lt_idx;
            lt_cnt->tid         = lt_cfg->temporal_id;
            lt_cnt->ref_mode    = lt_cfg->ref_mode;
            lt_cnt->ref_arg     = lt_cfg->ref_arg;
        }
    }

    MppEncCpbInfo *info = &cpb->info;

    if (info->dpb_size && info->dpb_size < cfg->cpb_info.dpb_size)
        p->hdr_need_update = 1;

    memcpy(info, &cfg->cpb_info, sizeof(cfg->cpb_info));

    enc_refs_dbg_flow("ref_cfg cpb size: lt %d st %d max lt_idx %d tid %d\n",
                      info->max_lt_cnt, info->max_st_cnt,
                      info->max_lt_idx, info->max_st_tid);

    enc_refs_dbg_func("leave %p cfg %p\n", refs, ref_cfg);
    return MPP_OK;
}